

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void pybind11::class_<ImPlotRange>::dealloc(value_and_holder *v_h)

{
  byte *pbVar1;
  void **ppvVar2;
  ulong uVar3;
  align_val_t aVar4;
  instance *piVar5;
  byte bVar6;
  error_scope scope;
  error_scope eStack_28;
  
  PyErr_Fetch(&eStack_28,&eStack_28.value,&eStack_28.trace);
  bVar6 = v_h->inst->field_0x30;
  if ((bVar6 & 2) == 0) {
    bVar6 = (v_h->inst->field_1).nonsimple.status[v_h->index];
  }
  else {
    bVar6 = bVar6 >> 2;
  }
  ppvVar2 = v_h->vh;
  if ((bVar6 & 1) == 0) {
    uVar3 = v_h->type->type_size;
    aVar4 = v_h->type->type_align;
    if (aVar4 < 0x11) {
      operator_delete(*ppvVar2,uVar3);
    }
    else {
      operator_delete(*ppvVar2,uVar3,aVar4);
    }
  }
  else {
    if (ppvVar2[1] != (void *)0x0) {
      operator_delete(ppvVar2[1],0x10);
    }
    ppvVar2[1] = (void *)0x0;
    piVar5 = v_h->inst;
    if ((piVar5->field_0x30 & 2) == 0) {
      pbVar1 = (piVar5->field_1).nonsimple.status + v_h->index;
      *pbVar1 = *pbVar1 & 0xfe;
    }
    else {
      piVar5->field_0x30 = piVar5->field_0x30 & 0xfb;
    }
  }
  *v_h->vh = (void *)0x0;
  error_scope::~error_scope(&eStack_28);
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        // We could be deallocating because we are cleaning up after a Python exception.
        // If so, the Python error indicator will be set. We need to clear that before
        // running the destructor, in case the destructor code calls more Python.
        // If we don't, the Python API will exit with an exception, and pybind11 will
        // throw error_already_set from the C++ destructor which is forbidden and triggers
        // std::terminate().
        error_scope scope;
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }